

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O0

void * __thiscall
Diligent::DataBlobAllocatorAdapter::AllocateAligned
          (DataBlobAllocatorAdapter *this,size_t Size,size_t Alignment,Char *dbgDescription,
          char *dbgFileName,Int32 dbgLineNumber)

{
  Char *Message;
  void *pvVar1;
  char (*in_stack_ffffffffffffff78) [2];
  char local_60 [8];
  undefined1 local_58 [8];
  string msg;
  Int32 dbgLineNumber_local;
  char *dbgFileName_local;
  Char *dbgDescription_local;
  size_t Alignment_local;
  size_t Size_local;
  DataBlobAllocatorAdapter *this_local;
  
  msg.field_2._12_4_ = dbgLineNumber;
  dbgDescription_local = (Char *)Alignment;
  Alignment_local = Size;
  Size_local = (size_t)this;
  if (8 < Alignment) {
    local_60[0] = '\b';
    local_60[1] = '\0';
    local_60[2] = '\0';
    local_60[3] = '\0';
    local_60[4] = '\0';
    local_60[5] = '\0';
    local_60[6] = '\0';
    local_60[7] = '\0';
    FormatString<char[12],unsigned_long,char[34],unsigned_long,char[2]>
              ((string *)local_58,(Diligent *)"Alignment (",(char (*) [12])&dbgDescription_local,
               (unsigned_long *)") exceeds the default alignment (",(char (*) [34])local_60,
               (unsigned_long *)0xf65f2d,in_stack_ffffffffffffff78);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AllocateAligned",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x80);
    std::__cxx11::string::~string((string *)local_58);
  }
  pvVar1 = Allocate(this,Alignment_local,dbgDescription,dbgFileName,msg.field_2._12_4_);
  return pvVar1;
}

Assistant:

void* DataBlobAllocatorAdapter::AllocateAligned(size_t Size, size_t Alignment, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY(Alignment <= sizeof(void*), "Alignment (", Alignment, ") exceeds the default alignment (", sizeof(void*), ")");
    return Allocate(Size, dbgDescription, dbgFileName, dbgLineNumber);
}